

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

void __thiscall BN::divmod(BN *this,BN *bn,BN *div,BN *mod)

{
  ushort uVar1;
  bt *diviser;
  BN *pBVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  divide_by_zero *this_00;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  pointer puVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  bt d;
  BN dividend;
  BN divider;
  vector<unsigned_short,_std::allocator<unsigned_short>_> temp;
  bt local_ba;
  BN local_b8;
  allocator_type local_91;
  BN *local_90;
  pointer local_88;
  pointer local_80;
  undefined4 local_74;
  BN local_70;
  BN *local_58;
  pointer local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  ulong uVar19;
  
  diviser = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)diviser;
  if (uVar6 < 3) {
    if (*diviser == 0) {
      this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
      divide_by_zero::divide_by_zero(this_00);
      __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
    }
    if (uVar6 == 2) {
      divbase(&local_b8,this,diviser);
      if (&local_b8 != div) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  (&div->ba,&local_b8.ba);
      }
      if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      modbase(&local_b8,this,
              (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start);
      if (&local_b8 != mod) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  (&mod->ba,&local_b8.ba);
      }
      goto LAB_0010ea2c;
    }
  }
  bVar3 = operator<(this,bn);
  if (bVar3) {
    bn0();
    if (&local_b8 != div) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&div->ba,&local_b8.ba)
      ;
    }
    if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (mod == this) {
      return;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&mod->ba,&this->ba);
    return;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_b8.ba,&this->ba);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_70.ba,&bn->ba);
  uVar6 = 0x10000 / (ulong)((bn->ba).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1] + 1);
  local_ba = (bt)uVar6;
  local_74 = (undefined4)uVar6;
  local_90 = div;
  local_58 = mod;
  if (local_ba != 1) {
    mulbaseappr(&local_b8,&local_ba);
    mulbaseappr(&local_70,&local_ba);
  }
  local_80 = local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_88 = local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_finish;
  lVar18 = (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&local_b8.ba,lVar18 + 2);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_70.ba,
             ((long)local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 1) + 1);
  lVar16 = (long)local_88 - (long)local_80;
  lVar12 = lVar16 >> 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_90->ba,(lVar18 - lVar12) + 2);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_48,lVar12 + 1,&local_91);
  pBVar2 = local_58;
  uVar11 = (lVar18 - lVar12) + 1;
  local_50 = (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar14 = lVar12 + (ulong)(lVar12 == 0);
  puVar15 = local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + ((lVar18 + 1) - lVar12);
  uVar6 = uVar11;
  do {
    lVar18 = uVar6 + lVar12;
    uVar1 = *(ushort *)
             ((long)local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar16 + -2);
    uVar19 = (ulong)*(uint *)(local_b8.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar18 + -1) / (ulong)uVar1
    ;
    uVar8 = *(uint *)(local_b8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar18 + -1) % (uint)uVar1;
    iVar4 = (int)uVar19;
    if ((iVar4 == 0x10000) ||
       (((uint)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar18 + -2] | uVar8 << 0x10) <
        (uint)*(ushort *)
               ((long)local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar16 + -4) * iVar4)) {
      uVar17 = iVar4 - 1;
      uVar19 = (ulong)uVar17;
      uVar8 = uVar8 + uVar1;
      if (uVar8 < 0x10000) {
        uVar5 = iVar4 - 2;
        if (*(ushort *)
             ((long)local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar16 + -4) * uVar17 <=
            ((uint)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar18 + -2] | uVar8 * 0x10000)) {
          uVar5 = uVar17;
        }
        uVar19 = (ulong)uVar5;
      }
    }
    iVar4 = (int)uVar19;
    if (iVar4 == 0) {
      uVar19 = 0;
    }
    else if (local_88 != local_80) {
      lVar9 = 0;
      lVar13 = 0;
      do {
        lVar13 = ((ulong)puVar15[lVar9] + lVar13) -
                 (ulong)((uint)local_70.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar9] * iVar4);
        puVar15[lVar9] = (unsigned_short)lVar13;
        lVar13 = lVar13 >> 0x10;
        lVar9 = lVar9 + 1;
      } while (lVar14 != lVar9);
      uVar7 = lVar13 + (ulong)local_b8.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar18];
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] = (unsigned_short)uVar7;
      if ((long)uVar7 < 0) {
        if (local_88 == local_80) {
          uVar10 = 0;
        }
        else {
          lVar13 = 0;
          uVar10 = 0;
          do {
            uVar10 = (ulong)local_70.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar13] +
                     puVar15[lVar13] + uVar10;
            puVar15[lVar13] = (unsigned_short)uVar10;
            uVar10 = uVar10 >> 0x10;
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
          uVar7 = (ulong)local_b8.ba.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar18];
        }
        uVar19 = (ulong)(iVar4 - 1);
        local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] = (short)uVar7 + (short)uVar10;
      }
    }
    local_50[uVar6] = (unsigned_short)uVar19;
    uVar6 = uVar6 - 1;
    puVar15 = puVar15 + -1;
  } while (uVar6 <= uVar11);
  puVar15 = (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar15 -
          (long)(local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while ((2 < uVar6 && (puVar15 = puVar15 + -1, *puVar15 == 0))) {
    (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar15;
    uVar6 = uVar6 - 2;
  }
  uVar6 = (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while ((2 < uVar6 &&
         (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] == 0))) {
    uVar6 = uVar6 - 2;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  if ((short)local_74 != 1) {
    divbaseappr(&local_b8,&local_ba);
  }
  if (&local_b8 != pBVar2) {
    puVar15 = (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar15 != (pointer)0x0) {
      operator_delete(puVar15);
    }
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010ea2c:
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BN::divmod(const BN& bn, BN& div, BN& mod) const
{
    if(bn.is0())
        throw divide_by_zero();

    if(bn.ba.size() == 1) {
        div = move(this -> divbase(bn.ba.front()));
        mod = move(this -> modbase(bn.ba.front()));
        return;
    }

    if(*this < bn) {
        div = BN::bn0();
        mod = *this;
        return;
    }

    BN dividend(*this);
    BN divider(bn);

    bt d = bsize  / (bn.ba.back() + 1);
    if (d != 1) {
        dividend.mulbaseappr(d);
        divider.mulbaseappr(d);
    }

    size_t n = divider.ba.size();
    size_t m = dividend.ba.size() - n + 1;

    dividend.ba.resize(dividend.ba.size() + 2);
    divider.ba.resize(divider.ba.size() + 1);

    div.ba.resize(m + 1);

    vector<bt> temp(n + 1);
    for (size_t j = m; j <= m; --j) {
        bt2 q = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) / divider.ba[n-1];
        bt2 r = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) % divider.ba[n-1];

        if (q == bsize || q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2]) {
            --q;
            r += divider.ba[n-1];
            if (r < bsize && q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2])
                --q;
        }

        if (!q) {
            div.ba[j] = 0;
            continue;
        }

        bt4s x = 0;
        for (size_t i = 0; i < n; ++i) {
            x += dividend.ba[j + i];
            x -= q * divider.ba[i];
            dividend.ba[j + i] = x;
            x >>= bz8;
        }
        x += dividend.ba[j + n];
        dividend.ba[j + n] = x;

        // If `x' is negative, than `q' is too large.
        // Decrement `q' and update `dividend'.
        if (x < 0) {
            --q;
            x = 0;
            for (size_t i = 0; i < n; ++i) {
                x += dividend.ba[j + i];
                x += divider.ba[i];
                dividend.ba[j + i] = x;
                x >>= bz8;
            }
            x += dividend.ba[j + n];
            dividend.ba[j + n] = x;
        }

        div.ba[j] = q;
    }
    Norm(div.ba);
    Norm(dividend.ba);

    if (d != 1)
        dividend.divbaseappr(d);
    mod = move(dividend);
}